

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstExpr.h
# Opt level: O2

String * __thiscall
nigel::AstReturning::returnTypeString_abi_cxx11_
          (String *__return_storage_ptr__,AstReturning *this,BasicType type)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch((int)this) {
  case 1:
    pcVar2 = "byte";
    paVar1 = &local_9;
    break;
  case 2:
    pcVar2 = "int";
    paVar1 = &local_a;
    break;
  case 3:
    pcVar2 = "unsigned byte";
    paVar1 = &local_b;
    break;
  case 4:
    pcVar2 = "unsigned int";
    paVar1 = &local_c;
    break;
  default:
    pcVar2 = "-!-UNKNOWN-!-";
    paVar1 = &local_d;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

static String returnTypeString( BasicType type )
		{
			if( type == tByte ) return "byte";
			else if( type == tInt ) return "int";
			else if( type == tUbyte ) return "unsigned byte";
			else if( type == tUint ) return "unsigned int";
			else return "-!-UNKNOWN-!-";
		}